

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O1

REF_STATUS ref_export_msh(REF_GRID ref_grid,char *filename)

{
  REF_NODE pRVar1;
  REF_GLOB *pRVar2;
  REF_DBL *pRVar3;
  REF_CELL ref_cell;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined4 uVar8;
  REF_STATUS RVar9;
  FILE *__stream;
  void *pvVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  REF_STATUS unaff_EBP;
  int iVar14;
  char *pcVar15;
  undefined8 uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  REF_GRID pRVar20;
  uint uVar21;
  uint local_c8 [4];
  uint uStack_b8;
  uint local_b4;
  uint local_b0;
  undefined4 local_ac;
  ulong local_a8;
  void *local_50;
  REF_GRID local_48;
  void *local_40;
  long local_38;
  
  pRVar1 = ref_grid->node;
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x87f,
           "ref_export_msh","unable to open file");
    return 2;
  }
  fprintf(__stream,"$MeshFormat\n%3.1f %d %d\n$EndMeshFormat\n",0x4010666666666666,0);
  if ((long)pRVar1->max < 0) {
    unaff_EBP = 1;
    pcVar15 = "malloc o2n of REF_INT negative";
LAB_0011bec9:
    bVar4 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x884,
           "ref_export_msh",pcVar15);
    pvVar10 = (void *)0x0;
  }
  else {
    pvVar10 = malloc((long)pRVar1->max << 2);
    if (pvVar10 == (void *)0x0) {
      unaff_EBP = 2;
      pcVar15 = "malloc o2n of REF_INT NULL";
      goto LAB_0011bec9;
    }
    bVar4 = true;
    if (0 < pRVar1->max) {
      lVar11 = 0;
      do {
        *(undefined4 *)((long)pvVar10 + lVar11 * 4) = 0xffffffff;
        lVar11 = lVar11 + 1;
      } while (lVar11 < pRVar1->max);
    }
  }
  if (!bVar4) {
    return unaff_EBP;
  }
  if ((long)pRVar1->max < 0) {
    unaff_EBP = 1;
    pcVar15 = "malloc n2o of REF_INT negative";
  }
  else {
    local_50 = malloc((long)pRVar1->max << 2);
    if (local_50 != (void *)0x0) {
      bVar4 = true;
      if (0 < pRVar1->max) {
        lVar11 = 0;
        do {
          *(undefined4 *)((long)local_50 + lVar11 * 4) = 0xffffffff;
          lVar11 = lVar11 + 1;
        } while (lVar11 < pRVar1->max);
      }
      goto LAB_0011bf71;
    }
    unaff_EBP = 2;
    pcVar15 = "malloc n2o of REF_INT NULL";
  }
  bVar4 = false;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x885,
         "ref_export_msh",pcVar15);
  local_50 = (void *)0x0;
LAB_0011bf71:
  if (bVar4) {
    if (pRVar1->max < 1) {
      uVar21 = 0;
    }
    else {
      pRVar2 = pRVar1->global;
      lVar11 = 0;
      uVar21 = 0;
      do {
        if (-1 < pRVar2[lVar11]) {
          *(uint *)((long)pvVar10 + lVar11 * 4) = uVar21;
          *(int *)((long)local_50 + (long)(int)uVar21 * 4) = (int)lVar11;
          uVar21 = uVar21 + 1;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < pRVar1->max);
    }
    local_48 = ref_grid;
    local_40 = pvVar10;
    fprintf(__stream,"$Nodes\n1 %d 1 %d\n%d 1 0 %d\n",(ulong)uVar21,(ulong)uVar21,3);
    if (0 < (int)uVar21) {
      uVar19 = 1;
      do {
        fprintf(__stream,"%d\n",uVar19);
        uVar12 = (uint)uVar19;
        uVar19 = (ulong)(uVar12 + 1);
      } while (uVar12 != uVar21);
    }
    pvVar10 = local_50;
    if (0 < (int)uVar21) {
      uVar19 = 0;
      do {
        pRVar3 = pRVar1->real;
        lVar11 = (long)*(int *)((long)pvVar10 + uVar19 * 4);
        fprintf(__stream,"%.16E %.16E %.16E\n",pRVar3[lVar11 * 0xf],pRVar3[lVar11 * 0xf + 1],
                pRVar3[lVar11 * 0xf + 2]);
        uVar19 = uVar19 + 1;
      } while (uVar21 != uVar19);
    }
    fwrite("$EndNodes\n",10,1,__stream);
    pRVar20 = local_48;
    lVar11 = 0;
    uVar13 = 0;
    uVar19 = 0;
    iVar14 = 0;
    do {
      iVar18 = local_48->cell[lVar11]->n;
      iVar17 = iVar18;
      if (iVar18 < iVar14) {
        iVar17 = iVar14;
      }
      bVar4 = 0 < iVar18;
      if (iVar18 < 1) {
        iVar18 = 0;
        iVar17 = iVar14;
      }
      iVar14 = iVar17;
      uVar19 = (ulong)(uint)((int)uVar19 + iVar18);
      uVar13 = (ulong)((int)uVar13 + (uint)bVar4);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x10);
    fprintf(__stream,"$Elements\n%d %d %d %d\n",uVar13,uVar19,1);
    lVar11 = 0;
    uVar21 = 0;
    do {
      ref_cell = pRVar20->cell[lVar11];
      if (0 < ref_cell->n) {
        switch(ref_cell->type) {
        case REF_CELL_EDG:
          uVar16 = 1;
          break;
        case REF_CELL_ED2:
          uVar16 = 8;
          break;
        case REF_CELL_ED3:
          uVar16 = 0x1a;
          break;
        case REF_CELL_TRI:
          uVar16 = 2;
          break;
        case REF_CELL_TR2:
          uVar16 = 9;
          break;
        case REF_CELL_TR3:
          uVar16 = 0x15;
          break;
        case REF_CELL_QUA:
          uVar16 = 3;
          break;
        case REF_CELL_QU2:
        case REF_CELL_PY2:
        case REF_CELL_PR2:
        case REF_CELL_HE2:
          return 6;
        case REF_CELL_TET:
          uVar16 = 4;
          break;
        case REF_CELL_PYR:
          uVar16 = 7;
          break;
        case REF_CELL_PRI:
          uVar16 = 6;
          break;
        case REF_CELL_HEX:
          uVar16 = 5;
          break;
        case REF_CELL_TE2:
          uVar16 = 0xb;
          break;
        default:
          uVar16 = 0xffffffff;
        }
        uVar21 = uVar21 + 1;
        fprintf(__stream,"%d %d %d %d\n",(ulong)uVar21,1,uVar16);
        if (0 < ref_cell->max) {
          iVar14 = 0;
          iVar18 = 0;
          local_38 = lVar11;
          do {
            RVar9 = ref_cell_nodes(ref_cell,iVar18,(REF_INT *)local_c8);
            uVar8 = local_ac;
            uVar6 = uStack_b8;
            uVar5 = local_c8[3];
            uVar12 = local_c8[0];
            if (RVar9 == 0) {
              if (ref_cell->type == REF_CELL_PYR) {
                local_c8[3] = local_c8[1];
                uStack_b8 = local_c8[2];
                local_c8[1] = uVar5;
                local_c8[2] = uVar6;
              }
              uVar6 = local_c8[3];
              uVar5 = local_c8[1];
              if (ref_cell->type == REF_CELL_TE2) {
                local_a8 = local_a8 << 0x20 | local_a8 >> 0x20;
              }
              if (ref_cell->type == REF_CELL_TRI) {
                local_c8[0] = local_c8[2];
                local_c8[2] = uVar12;
              }
              uVar12 = local_c8[0];
              if (ref_cell->type == REF_CELL_TR2) {
                local_c8[0] = local_c8[2];
                local_c8[2] = uVar12;
                local_c8[3] = uStack_b8;
                uStack_b8 = uVar6;
              }
              uVar7 = uStack_b8;
              uVar6 = local_c8[3];
              uVar12 = local_c8[0];
              if (ref_cell->type == REF_CELL_TR2) {
                local_c8[0] = local_c8[2];
                local_c8[2] = uVar12;
                local_c8[3] = local_b0;
                uStack_b8 = local_b4;
                local_b4 = uVar6;
                local_b0 = uVar7;
                local_ac = (undefined4)local_a8;
                local_a8 = CONCAT44(local_a8._4_4_,uVar8);
              }
              uVar12 = local_c8[0];
              if (ref_cell->type == REF_CELL_QUA) {
                local_c8[0] = local_c8[3];
                local_c8[1] = local_c8[2];
                local_c8[2] = uVar5;
                local_c8[3] = uVar12;
              }
              if (ref_cell->last_node_is_an_id == 0) {
                uVar12 = iVar14 + 1;
              }
              else {
                uVar12 = local_c8[ref_cell->node_per];
              }
              fprintf(__stream,"%d",(ulong)uVar12);
              if (0 < ref_cell->node_per) {
                lVar11 = 0;
                do {
                  fprintf(__stream," %d",(ulong)(local_c8[lVar11] + 1));
                  lVar11 = lVar11 + 1;
                } while (lVar11 < ref_cell->node_per);
              }
              fputc(10,__stream);
              iVar14 = iVar14 + 1;
            }
            iVar18 = iVar18 + 1;
            lVar11 = local_38;
            pRVar20 = local_48;
          } while (iVar18 < ref_cell->max);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x10);
    fwrite("$EndElements\n",0xd,1,__stream);
    if (local_50 != (void *)0x0) {
      free(local_50);
    }
    if (local_40 != (void *)0x0) {
      free(local_40);
    }
    fclose(__stream);
    unaff_EBP = 0;
  }
  return unaff_EBP;
}

Assistant:

REF_FCN static REF_STATUS ref_export_msh(REF_GRID ref_grid,
                                         const char *filename) {
  FILE *f;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node, nnode;
  REF_INT dim = 3;
  REF_INT *o2n, *n2o;
  REF_INT group, nbloc;
  REF_INT ncell, maxncell;
  REF_INT type;
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell_node;

  double version = 4.1;
  int filetype =
      0; /* file-type(ASCII int; 0 for ASCII mode, 1 for binary mode) */
  int datasize = 8; /* data-size(ASCII int; sizeof(size_t)) */

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "$MeshFormat\n%3.1f %d %d\n$EndMeshFormat\n", version, filetype,
          datasize);

  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  ref_malloc_init(n2o, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    o2n[node] = nnode;
    n2o[nnode] = node;
    nnode++;
  }
  fprintf(f, "$Nodes\n1 %d 1 %d\n%d 1 0 %d\n", nnode, nnode, dim, nnode);
  for (node = 0; node < nnode; node++) {
    fprintf(f, "%d\n", node + 1);
  }
  for (node = 0; node < nnode; node++) {
    fprintf(f, "%.16E %.16E %.16E\n", ref_node_xyz(ref_node, 0, n2o[node]),
            ref_node_xyz(ref_node, 1, n2o[node]),
            ref_node_xyz(ref_node, 2, n2o[node]));
  }
  fprintf(f, "$EndNodes\n");

  nbloc = 0;
  ncell = 0;
  maxncell = 0;
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    if (0 < ref_cell_n(ref_cell)) {
      nbloc++;
      ncell += ref_cell_n(ref_cell);
      maxncell = MAX(maxncell, ref_cell_n(ref_cell));
    }
  }

  fprintf(f, "$Elements\n%d %d %d %d\n", nbloc, ncell, 1, maxncell);
  nbloc = 0;
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    if (0 < ref_cell_n(ref_cell)) {
      nbloc++;
      type = REF_EMPTY;
      switch (ref_cell_type(ref_cell)) {
        case REF_CELL_EDG:
          type = 1;
          break;
        case REF_CELL_ED2:
          type = 8;
          break;
        case REF_CELL_ED3:
          type = 26;
          break;
        case REF_CELL_TRI:
          type = 2;
          break;
        case REF_CELL_TR2:
          type = 9;
          break;
        case REF_CELL_TR3:
          type = 21;
          break;
        case REF_CELL_QUA:
          type = 3;
          break;
        case REF_CELL_TET:
          type = 4;
          break;
        case REF_CELL_TE2:
          type = 11;
          break;
        case REF_CELL_PYR:
          type = 7;
          break;
        case REF_CELL_PRI:
          type = 6;
          break;
        case REF_CELL_HEX:
          type = 5;
          break;
        case REF_CELL_QU2:
        case REF_CELL_PY2:
        case REF_CELL_PR2:
        case REF_CELL_HE2:
          return REF_IMPLEMENT;
      }
      fprintf(f, "%d %d %d %d\n", nbloc, 1, type, ref_cell_n(ref_cell));
      ncell = 0;
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        if (REF_CELL_PYR == ref_cell_type(ref_cell)) { /* on side */
          REF_INT n0, n1, n2, n3, n4;
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          n3 = nodes[3];
          n4 = nodes[4];
          nodes[0] = n0;
          nodes[3] = n1;
          nodes[4] = n2;
          nodes[1] = n3;
          nodes[2] = n4;
        }
        if (REF_CELL_TE2 == ref_cell_type(ref_cell)) { /* swap 8-9 */
          REF_INT n9;
          n9 = nodes[9];
          nodes[9] = nodes[8];
          nodes[8] = n9;
        }
        if (REF_CELL_TRI == ref_cell_type(ref_cell)) { /* outward normal */
          REF_INT n0, n1, n2;
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          nodes[0] = n2;
          nodes[1] = n1;
          nodes[2] = n0;
        }
        if (REF_CELL_TR2 == ref_cell_type(ref_cell)) { /* outward normal */
          REF_INT n0, n1, n2, n3, n4, n5;
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          n3 = nodes[3];
          n4 = nodes[4];
          n5 = nodes[5];
          nodes[0] = n2;
          nodes[1] = n1;
          nodes[2] = n0;
          nodes[3] = n4;
          nodes[4] = n3;
          nodes[5] = n5;
        }
        if (REF_CELL_TR2 == ref_cell_type(ref_cell)) { /* outward normal */
          REF_INT n0, n1, n2, n3, n4, n5, n6, n7, n8, n9;
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          n3 = nodes[3];
          n4 = nodes[4];
          n5 = nodes[5];
          n6 = nodes[6];
          n7 = nodes[7];
          n8 = nodes[8];
          n9 = nodes[9];
          nodes[0] = n2;
          nodes[1] = n1;
          nodes[2] = n0;
          nodes[3] = n6;
          nodes[4] = n5;
          nodes[5] = n3;
          nodes[6] = n4;
          nodes[7] = n8;
          nodes[8] = n7;
          nodes[9] = n9;
        }
        if (REF_CELL_QUA == ref_cell_type(ref_cell)) { /* outward normal */
          REF_INT n0, n1, n2, n3;
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          n3 = nodes[3];
          nodes[0] = n3;
          nodes[1] = n2;
          nodes[2] = n1;
          nodes[3] = n0;
        }
        if (ref_cell_last_node_is_an_id(ref_cell)) {
          fprintf(f, "%d", nodes[ref_cell_id_index(ref_cell)]);
        } else {
          fprintf(f, "%d", ncell + 1);
        }
        each_ref_cell_cell_node(ref_cell, cell_node) {
          fprintf(f, " %d", nodes[cell_node] + 1);
        }
        fprintf(f, "\n");
        ncell++;
      }
    }
  }
  fprintf(f, "$EndElements\n");

  ref_free(n2o);
  ref_free(o2n);

  fclose(f);

  return REF_SUCCESS;
}